

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getrands.cpp
# Opt level: O0

void __thiscall getRands::userandfile(getRands *this)

{
  undefined1 auVar1 [16];
  FILE *__stream;
  ulong uVar2;
  OASIS_FLOAT *pOVar3;
  size_t sVar4;
  longlong p;
  FILE *fin;
  getRands *this_local;
  
  __stream = fopen("static/random.bin","rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"FATAL: %s: Error opening file %s\n","userandfile","static/random.bin");
    exit(-1);
  }
  fseek(__stream,0,2);
  uVar2 = ftell(__stream);
  this->buffersize_ = (uint)(uVar2 >> 2);
  fseek(__stream,0,0);
  auVar1 = ZEXT416(this->buffersize_) * ZEXT816(4);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pOVar3 = (OASIS_FLOAT *)operator_new__(uVar2);
  this->buf_ = pOVar3;
  sVar4 = fread(this->buf_,4,(ulong)this->buffersize_,__stream);
  if (sVar4 != this->buffersize_) {
    fprintf(_stderr,"FATAL: %s: Error reading random number file\n","userandfile");
    exit(-1);
  }
  fclose(__stream);
  return;
}

Assistant:

void getRands::userandfile()
{
	FILE *fin = fopen(RANDOM_FILE, "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: Error opening file %s\n", __func__, RANDOM_FILE);
		exit(-1);
	}
	flseek(fin, 0L, SEEK_END);
	long long p = fltell(fin);
	buffersize_ = p / sizeof(OASIS_FLOAT);
	//		_buffersize = _buffersize - 1;		// first 4 bytes is the limit
	fseek(fin, 0L, SEEK_SET);

	buf_ = new OASIS_FLOAT[buffersize_];
	if (fread(buf_, sizeof(OASIS_FLOAT), buffersize_, fin) != buffersize_) {
		fprintf(stderr, "FATAL: %s: Error reading random number file\n", __func__);
		exit(-1);
	}
	fclose(fin);
}